

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureGatherTests.cpp
# Opt level: O2

bool __thiscall
glcts::anon_unknown_0::GatherBase::IsFloatingPointTexture(GatherBase *this,GLenum internal_format)

{
  bool bVar1;
  int iVar2;
  
  iVar2 = (int)this;
  bVar1 = true;
  if ((((1 < iVar2 - 0x8814U) && (iVar2 != 0x822e)) && (iVar2 != 0x8230)) && (iVar2 != 0x8cac)) {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool IsFloatingPointTexture(GLenum internal_format)
	{
		switch (internal_format)
		{
		case GL_R32F:
		case GL_RG32F:
		case GL_RGB32F:
		case GL_RGBA32F:
		case GL_DEPTH_COMPONENT32F:
			return true;
		}

		return false;
	}